

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O2

IndexPair __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::find_zero(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
            *this,Index start_row)

{
  const_reference cVar1;
  Index IVar2;
  pointer pVVar3;
  ulong uVar4;
  pointer pAVar5;
  ulong uVar6;
  ulong __n;
  IndexPair IVar7;
  size_type sStack_50;
  
  uVar4 = (long)(this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  uVar6 = 0;
  do {
    if (uVar6 == uVar4) {
      sStack_50 = 0xffffffffffffffff;
      __n = sStack_50;
LAB_00140e34:
      IVar7.col = sStack_50;
      IVar7.row = __n;
      return IVar7;
    }
    __n = uVar6 + start_row;
    IVar2 = -__n;
    if (uVar4 <= __n) {
      __n = 0;
      start_row = IVar2;
    }
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->row_cover,__n);
    if (!cVar1) {
      pVVar3 = (this->graph_->vertices_).
               super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
               ._M_impl.super__Vector_impl_data._M_start;
      for (pAVar5 = *(pointer *)&((Adjacencies *)((long)(pVVar3 + __n) + 0x20))->vector_;
          pAVar5 != *(pointer *)((long)(pVVar3 + __n) + 0x28); pAVar5 = pAVar5 + 1) {
        cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (&this->col_cover,
                           pAVar5->vertex_ -
                           ((long)(this->rows_).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->rows_).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3));
        if ((!cVar1) &&
           (ABS((this->costs_->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[pAVar5->edge_]) < 2.220446049250313e-16)) {
          sStack_50 = pAVar5->vertex_;
          goto LAB_00140e34;
        }
        pVVar3 = (this->graph_->vertices_).
                 super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

typename Matching<GRAPH, COST, MASK>::IndexPair
Matching<GRAPH, COST, MASK>::find_zero(Index start_row) const
{
    auto const& n_rows = rows_.size();
    for (Index idx = 0; idx < n_rows; ++idx) {

        // start from start_row, and wrap around at n_rows.
        auto row = start_row + idx;
        if (row >= n_rows) {
            start_row = -row;
            row = 0;
        }

        if (row_cover[row])
            continue;

        for (auto it = graph_.adjacenciesFromVertexBegin(row);
             it != graph_.adjacenciesFromVertexEnd(row); ++it) {
            if (!col_cover[col_of_idx(it->vertex())] &&
                std::abs(costs_[it->edge()]) <
                    std::numeric_limits<value_type>::epsilon())
                return { row, it->vertex() };
        }
    }

    return { IDXMAX, IDXMAX };
}